

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

ObjectSplit * __thiscall
embree::avx::
HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
parallel_object_find
          (ObjectSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize,SplitInfo *info)

{
  float fVar1;
  undefined8 uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char cVar8;
  long lVar9;
  ulong uVar10;
  runtime_error *this_00;
  int iVar11;
  undefined8 *puVar12;
  long lVar13;
  undefined1 *puVar14;
  int iVar15;
  long lVar16;
  size_t sVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  undefined1 *puVar20;
  uint *puVar21;
  size_t sVar22;
  bool bVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  undefined1 auVar28 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  undefined1 auVar30 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  BinMapping<32UL> mapping;
  task_group_context context;
  ObjectBinner binner;
  vfloat4 rAreas [32];
  task_group_context *in_stack_ffffffffffffe0c0;
  undefined1 local_1f00 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ee0;
  undefined1 local_1ed0 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ec0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1eb0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ea0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e90;
  task_group_context local_1e80 [3];
  undefined4 auStack_1cd0 [4];
  undefined4 auStack_1cc0 [4];
  undefined4 auStack_1cb0 [4];
  undefined4 auStack_1ca0 [4];
  undefined4 auStack_1c90 [4];
  undefined1 local_1c80 [3580];
  undefined4 uStack_e84;
  undefined1 local_e80 [20];
  float afStack_e6c [911];
  
  puVar12 = (undefined8 *)(local_1c80 + 0xc00);
  for (lVar9 = 0x50; lVar9 != 0xc50; lVar9 = lVar9 + 0x60) {
    *(undefined4 *)((long)auStack_1c90 + lVar9) = 0x7f800000;
    *(undefined4 *)((long)auStack_1c90 + lVar9 + 4) = 0x7f800000;
    *(undefined4 *)((long)auStack_1c90 + lVar9 + 8) = 0x7f800000;
    *(undefined4 *)((long)auStack_1c90 + lVar9 + 0xc) = 0x7f800000;
    *(undefined4 *)(local_1c80 + lVar9) = 0xff800000;
    *(undefined4 *)(local_1c80 + lVar9 + 4) = 0xff800000;
    *(undefined4 *)(local_1c80 + lVar9 + 8) = 0xff800000;
    *(undefined4 *)(local_1c80 + lVar9 + 0xc) = 0xff800000;
    *(undefined4 *)((long)auStack_1cb0 + lVar9) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cb0 + lVar9 + 4) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cb0 + lVar9 + 8) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cb0 + lVar9 + 0xc) = 0x7f800000;
    *(undefined4 *)((long)auStack_1ca0 + lVar9) = 0xff800000;
    *(undefined4 *)((long)auStack_1ca0 + lVar9 + 4) = 0xff800000;
    *(undefined4 *)((long)auStack_1ca0 + lVar9 + 8) = 0xff800000;
    *(undefined4 *)((long)auStack_1ca0 + lVar9 + 0xc) = 0xff800000;
    *(undefined4 *)((long)auStack_1cd0 + lVar9) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cd0 + lVar9 + 4) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cd0 + lVar9 + 8) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cd0 + lVar9 + 0xc) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cc0 + lVar9) = 0xff800000;
    *(undefined4 *)((long)auStack_1cc0 + lVar9 + 4) = 0xff800000;
    *(undefined4 *)((long)auStack_1cc0 + lVar9 + 8) = 0xff800000;
    *(undefined4 *)((long)auStack_1cc0 + lVar9 + 0xc) = 0xff800000;
    *puVar12 = 0;
    puVar12[1] = 0;
    puVar12 = puVar12 + 2;
  }
  uVar3 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar4 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  fVar24 = (float)(uVar4 - uVar3) * 0.05 + 4.0;
  uVar10 = (ulong)fVar24;
  puVar20 = (undefined1 *)((long)(fVar24 - 9.223372e+18) & (long)uVar10 >> 0x3f | uVar10);
  local_1ec0._0_8_ = &DAT_00000020;
  if (puVar20 < &DAT_00000020) {
    local_1ec0._0_8_ = puVar20;
  }
  local_1ed0._8_8_ = &local_1ec0;
  local_1eb0 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0;
  auVar5 = vsubps_avx((undefined1  [16])(set->super_CentGeomBBox3fa).centBounds.upper.field_0,
                      (undefined1  [16])local_1eb0);
  auVar28._8_4_ = 0x704ec3d;
  auVar28._0_8_ = 0x704ec3d0704ec3d;
  auVar28._12_4_ = 0x704ec3d;
  auVar38 = vmaxps_avx(auVar28,auVar5);
  auVar5 = vcmpps_avx(auVar38,auVar28,6);
  auVar28 = vshufps_avx(ZEXT416((uint)((float)(long)local_1ec0._0_8_ * 0.99)),
                        ZEXT416((uint)((float)(long)local_1ec0._0_8_ * 0.99)),0);
  auVar38 = vdivps_avx(auVar28,auVar38);
  local_1ea0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vandps_avx(auVar5,auVar38);
  local_1e90._0_8_ = this;
  local_1e90._8_8_ = local_1ed0._8_8_;
  tbb::detail::d1::task_group_context::task_group_context(local_1e80,(context_traits)0x4,CUSTOM_CTX)
  ;
  local_1ee0._8_8_ = uVar3;
  local_1ee0._0_8_ = uVar4;
  local_1ed0._0_8_ = 0x400;
  local_1f00._8_8_ = &local_1e90;
  local_1f00._0_8_ = (anon_class_16_2_ed117de8_conflict5 *)(local_1ed0 + 8);
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::avx::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::avx::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_object_find(embree::avx::PrimInfoExtRange_const&,unsigned_long,embree::avx::SplitInfoT<embree::BBox<embree::Vec3fa>>&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_object_find(embree::avx::PrimInfoExtRange_const&,unsigned_long,embree::avx::SplitInfoT<embree::BBox<embree::Vec3fa>>&)::_lambda(embree::avx::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const&,embree::avx::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::avx::BinInfoT<32ul,emb___::Vec3fa>>const__embree__avx__BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const___1_>
            ((BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_e80,
             (d1 *)&local_1ee0.field_1,(blocked_range<unsigned_long> *)local_1c80,
             (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_1f00,
             (anon_class_16_2_ed117de8_conflict5 *)(local_1ed0 + 8),
             (anon_class_8_1_a667e50d *)local_1e80,in_stack_ffffffffffffe0c0);
  cVar8 = tbb::detail::r1::is_group_execution_cancelled(local_1e80);
  if (cVar8 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(local_1e80);
    BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_>::operator=
              ((BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_1c80,
               (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_e80);
    lVar13 = local_1ec0._0_8_ * 0x60 + -0x10;
    lVar9 = local_1ec0._0_8_ * 0x10 + 0xbf0;
    auVar25 = ZEXT816(0) << 0x40;
    auVar37._8_4_ = 0x7f800000;
    auVar37._0_8_ = 0x7f8000007f800000;
    auVar37._12_4_ = 0x7f800000;
    auVar38._8_4_ = 0xff800000;
    auVar38._0_8_ = 0xff800000ff800000;
    auVar38._12_4_ = 0xff800000;
    lVar16 = local_1ec0._0_8_ * 0x10;
    auVar30 = auVar37;
    auVar5 = auVar38;
    auVar34 = auVar37;
    auVar28 = auVar38;
    for (puVar20 = (undefined1 *)0x1; (undefined1 *)local_1ec0._0_8_ != puVar20;
        puVar20 = puVar20 + 1) {
      auVar25 = vpaddd_avx(auVar25,*(undefined1 (*) [16])(local_1c80 + lVar9));
      *(undefined1 (*) [16])((long)&local_1e90 + lVar16) = auVar25;
      auVar30 = vminps_avx(auVar30,*(undefined1 (*) [16])((long)auStack_1cd0 + lVar13));
      auVar5 = vmaxps_avx(auVar5,*(undefined1 (*) [16])((long)auStack_1cc0 + lVar13));
      auVar37 = vminps_avx(auVar37,*(undefined1 (*) [16])((long)auStack_1cb0 + lVar13));
      auVar6 = vsubps_avx(auVar5,auVar30);
      auVar38 = vmaxps_avx(auVar38,*(undefined1 (*) [16])((long)auStack_1ca0 + lVar13));
      auVar33 = vsubps_avx(auVar38,auVar37);
      auVar35 = vinsertps_avx(auVar33,auVar6,0x4c);
      auVar36 = vshufpd_avx(auVar6,auVar6,1);
      auVar36 = vinsertps_avx(auVar36,auVar33,0x9c);
      auVar6 = vunpcklps_avx(auVar6,auVar33);
      auVar33._0_4_ = (auVar36._0_4_ + auVar35._0_4_) * auVar6._0_4_ + auVar36._0_4_ * auVar35._0_4_
      ;
      auVar33._4_4_ = (auVar36._4_4_ + auVar35._4_4_) * auVar6._4_4_ + auVar36._4_4_ * auVar35._4_4_
      ;
      auVar33._8_4_ = (auVar36._8_4_ + auVar35._8_4_) * auVar6._8_4_ + auVar36._8_4_ * auVar35._8_4_
      ;
      auVar33._12_4_ =
           (auVar36._12_4_ + auVar35._12_4_) * auVar6._12_4_ + auVar36._12_4_ * auVar35._12_4_;
      auVar34 = vminps_avx(auVar34,*(undefined1 (*) [16])((long)auStack_1c90 + lVar13));
      auVar28 = vmaxps_avx(auVar28,*(undefined1 (*) [16])(local_1c80 + lVar13));
      uVar2 = vmovlps_avx(auVar33);
      *(undefined8 *)(local_1c80 + lVar16 + 0xdf0) = uVar2;
      auVar6 = vsubps_avx(auVar28,auVar34);
      auVar35 = vmovshdup_avx(auVar6);
      auVar36 = vshufpd_avx(auVar6,auVar6,1);
      *(float *)(local_1c80 + lVar16 + 0xdf8) =
           (auVar35._0_4_ + auVar36._0_4_) * auVar6._0_4_ + auVar35._0_4_ * auVar36._0_4_;
      *(undefined4 *)((long)&uStack_e84 + lVar16) = 0;
      lVar13 = lVar13 + -0x60;
      lVar9 = lVar9 + -0x10;
      lVar16 = lVar16 + -0x10;
    }
    uVar10 = 0xffffffffffffffff;
    auVar37 = vpshufd_avx(ZEXT416((uint)~(-1 << ((byte)logBlockSize & 0x1f))),0);
    puVar20 = (undefined1 *)0x1;
    auVar28 = ZEXT816(0) << 0x40;
    auVar30._8_4_ = 0xff800000;
    auVar30._0_8_ = 0xff800000ff800000;
    auVar30._12_4_ = 0xff800000;
    auVar34._8_8_ = 0x100000001;
    auVar34._0_8_ = 0x100000001;
    local_1ee0.m128[2] = INFINITY;
    local_1ee0._0_8_ = 0x7f8000007f800000;
    local_1ee0.m128[3] = INFINITY;
    local_1f00._0_16_ = ZEXT816(0) << 0x40;
    pauVar19 = (undefined1 (*) [16])(local_1c80 + 0x50);
    lVar9 = 0;
    aVar31 = local_1ee0;
    aVar32 = local_1ee0;
    auVar38 = auVar30;
    aVar27 = local_1ee0;
    auVar5 = auVar30;
    while (puVar20 < (ulong)local_1ec0._0_8_) {
      auVar28 = vpaddd_avx(auVar28,*(undefined1 (*) [16])(local_1c80 + lVar9 + 0xc00));
      aVar27.m128 = (__m128)vminps_avx(aVar27.m128,pauVar19[-5]);
      auVar5 = vmaxps_avx(auVar5,pauVar19[-4]);
      aVar32.m128 = (__m128)vminps_avx(aVar32.m128,pauVar19[-3]);
      auVar38 = vmaxps_avx(auVar38,pauVar19[-2]);
      auVar36 = vsubps_avx(auVar5,(undefined1  [16])aVar27);
      auVar33 = vsubps_avx(auVar38,(undefined1  [16])aVar32);
      aVar31.m128 = (__m128)vminps_avx(aVar31.m128,pauVar19[-1]);
      auVar30 = vmaxps_avx(auVar30,*pauVar19);
      auVar7 = vsubps_avx(auVar30,(undefined1  [16])aVar31);
      auVar25 = vshufps_avx(auVar36,auVar7,0x65);
      auVar25 = vblendps_avx(auVar25,auVar33,2);
      auVar35 = vshufps_avx(auVar36,auVar7,0x96);
      auVar6 = vinsertps_avx(auVar35,auVar33,0x90);
      auVar35 = vshufps_avx(auVar36,auVar7,0);
      auVar33 = vinsertps_avx(auVar35,auVar33,0x10);
      auVar35 = vpaddd_avx(auVar37,auVar28);
      auVar36 = vpsrld_avx(auVar35,ZEXT416((uint)logBlockSize));
      auVar35 = vpaddd_avx(auVar37,*(undefined1 (*) [16])(local_1e80[0].padding + lVar9 + -0x38));
      auVar26 = vpsrld_avx(auVar35,ZEXT416((uint)logBlockSize));
      auVar35 = vpsrad_avx(auVar36,0x1f);
      auVar39._8_8_ = 0x4f0000004f000000;
      auVar39._0_8_ = 0x4f0000004f000000;
      auVar7 = vpand_avx(auVar39,auVar35);
      auVar40._8_4_ = 0x7fffffff;
      auVar40._0_8_ = 0x7fffffff7fffffff;
      auVar40._12_4_ = 0x7fffffff;
      auVar35 = vpand_avx(auVar40,auVar36);
      auVar35 = vcvtdq2ps_avx(auVar35);
      auVar36 = vpsrad_avx(auVar26,0x1f);
      auVar39 = vpand_avx(auVar39,auVar36);
      auVar36 = vpand_avx(auVar26,auVar40);
      auVar36 = vcvtdq2ps_avx(auVar36);
      auVar26._0_4_ =
           (auVar33._0_4_ * (auVar25._0_4_ + auVar6._0_4_) + auVar25._0_4_ * auVar6._0_4_) *
           (auVar35._0_4_ + auVar7._0_4_) +
           (auVar36._0_4_ + auVar39._0_4_) * *(float *)(local_e80 + lVar9 + 0x10);
      auVar26._4_4_ =
           (auVar33._4_4_ * (auVar25._4_4_ + auVar6._4_4_) + auVar25._4_4_ * auVar6._4_4_) *
           (auVar35._4_4_ + auVar7._4_4_) +
           (auVar36._4_4_ + auVar39._4_4_) * *(float *)((long)afStack_e6c + lVar9);
      auVar26._8_4_ =
           (auVar33._8_4_ * (auVar25._8_4_ + auVar6._8_4_) + auVar25._8_4_ * auVar6._8_4_) *
           (auVar35._8_4_ + auVar7._8_4_) +
           (auVar36._8_4_ + auVar39._8_4_) * *(float *)((long)afStack_e6c + lVar9 + 4);
      auVar26._12_4_ =
           (auVar33._12_4_ * (auVar25._12_4_ + auVar6._12_4_) + auVar25._12_4_ * auVar6._12_4_) *
           (auVar35._12_4_ + auVar7._12_4_) +
           (auVar36._12_4_ + auVar39._12_4_) * *(float *)((long)afStack_e6c + lVar9 + 8);
      auVar25 = vcmpps_avx(auVar26,(undefined1  [16])local_1ee0,1);
      local_1f00._0_16_ = vblendvps_avx(local_1f00._0_16_,auVar34,auVar25);
      local_1ee0.m128 = (__m128)vminps_avx(auVar26,local_1ee0.m128);
      puVar20 = puVar20 + 1;
      auVar34 = vpsubd_avx(auVar34,_DAT_01f46b70);
      lVar9 = lVar9 + 0x10;
      pauVar19 = pauVar19 + 6;
    }
    fVar24 = INFINITY;
    iVar11 = 0;
    for (uVar18 = 0; uVar18 != 3; uVar18 = uVar18 + 1) {
      fVar1 = *(float *)((long)&local_1ea0 + uVar18 * 4);
      if ((((fVar1 != 0.0) || (NAN(fVar1))) &&
          (fVar1 = *(float *)((long)&local_1ee0 + uVar18 * 4), fVar1 < fVar24)) &&
         (*(int *)(local_1f00 + uVar18 * 4) != 0)) {
        uVar10 = uVar18 & 0xffffffff;
        iVar11 = *(int *)(local_1f00 + uVar18 * 4);
        fVar24 = fVar1;
      }
    }
    __return_storage_ptr__->sah = fVar24;
    iVar15 = (int)uVar10;
    __return_storage_ptr__->dim = iVar15;
    (__return_storage_ptr__->field_2).pos = iVar11;
    __return_storage_ptr__->data = 0;
    (__return_storage_ptr__->mapping).num = local_1ec0._0_8_;
    *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = local_1eb0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = local_1eb0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = local_1ea0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = local_1ea0._8_8_;
    if (iVar15 == -1) {
      info->leftCount = SUB168(ZEXT816(0) << 0x20,0);
      info->rightCount = SUB168(ZEXT816(0) << 0x20,8);
      aVar31.m128[2] = INFINITY;
      aVar31._0_8_ = 0x7f8000007f800000;
      aVar31.m128[3] = INFINITY;
      (info->leftBounds).lower.field_0 = aVar31;
      aVar27.m128[2] = -INFINITY;
      aVar27._0_8_ = 0xff800000ff800000;
      aVar27.m128[3] = -INFINITY;
      aVar32 = aVar27;
    }
    else {
      puVar14 = (undefined1 *)(long)iVar11;
      lVar9 = (long)iVar15;
      puVar21 = (uint *)(local_1c80 + lVar9 * 4 + 0xc00);
      pauVar19 = (undefined1 (*) [16])(local_1c80 + lVar9 * 0x20 + 0x10);
      aVar27.m128[2] = -INFINITY;
      aVar27._0_8_ = 0xff800000ff800000;
      aVar27.m128[3] = -INFINITY;
      aVar29.m128[2] = INFINITY;
      aVar29._0_8_ = 0x7f8000007f800000;
      aVar29.m128[3] = INFINITY;
      sVar17 = 0;
      puVar20 = puVar14;
      while (bVar23 = puVar20 != (undefined1 *)0x0, puVar20 = puVar20 + -1, bVar23) {
        sVar17 = sVar17 + *puVar21;
        aVar29.m128 = (__m128)vminps_avx(aVar29.m128,pauVar19[-1]);
        aVar27.m128 = (__m128)vmaxps_avx(aVar27.m128,*pauVar19);
        puVar21 = puVar21 + 4;
        pauVar19 = pauVar19 + 6;
      }
      puVar21 = (uint *)(local_1c80 + (long)puVar14 * 0x10 + lVar9 * 4 + 0xc00);
      pauVar19 = (undefined1 (*) [16])(local_1c80 + (long)puVar14 * 0x60 + lVar9 * 0x20 + 0x10);
      aVar32.m128[2] = -INFINITY;
      aVar32._0_8_ = 0xff800000ff800000;
      aVar32.m128[3] = -INFINITY;
      aVar31.m128[2] = INFINITY;
      aVar31._0_8_ = 0x7f8000007f800000;
      aVar31.m128[3] = INFINITY;
      sVar22 = 0;
      for (; puVar14 < (ulong)local_1ec0._0_8_; puVar14 = puVar14 + 1) {
        aVar31.m128 = (__m128)vminps_avx(aVar31.m128,pauVar19[-1]);
        aVar32.m128 = (__m128)vmaxps_avx(aVar32.m128,*pauVar19);
        sVar22 = sVar22 + *puVar21;
        puVar21 = puVar21 + 4;
        pauVar19 = pauVar19 + 6;
      }
      info->leftCount = sVar17;
      info->rightCount = sVar22;
      (info->leftBounds).lower.field_0 = aVar29;
    }
    (info->leftBounds).upper.field_0 = aVar27;
    (info->rightBounds).lower.field_0 = aVar31;
    (info->rightBounds).upper.field_0 = aVar32;
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

parallel_object_find(const PrimInfoExtRange& set, const size_t logBlockSize, SplitInfo &info)
        {
          ObjectBinner binner(empty);
          const BinMapping<OBJECT_BINS> mapping(set);
          const BinMapping<OBJECT_BINS>& _mapping = mapping; // CLANG 3.4 parser bug workaround
          binner = parallel_reduce(set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,binner,
                                   [&] (const range<size_t>& r) -> ObjectBinner { ObjectBinner binner(empty); binner.bin(prims0+r.begin(),r.size(),_mapping); return binner; },
                                   [&] (const ObjectBinner& b0, const ObjectBinner& b1) -> ObjectBinner { ObjectBinner r = b0; r.merge(b1,_mapping.size()); return r; });
          ObjectSplit s = binner.best(mapping,logBlockSize);
          binner.getSplitInfo(mapping, s, info);
          return s;
        }